

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O0

REF_STATUS ref_part_scalar(REF_GRID ref_grid,REF_INT *ldim,REF_DBL **scalar,char *filename)

{
  REF_NODE ref_node_00;
  int iVar1;
  size_t sVar2;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  size_t end_of_string;
  REF_NODE ref_node;
  char *filename_local;
  REF_DBL **scalar_local;
  REF_INT *ldim_local;
  REF_GRID ref_grid_local;
  
  ref_node_00 = ref_grid->node;
  sVar2 = strlen(filename);
  if ((sVar2 < 0xd) || (iVar1 = strcmp(filename + (sVar2 - 0xc),".restart_sol"), iVar1 != 0)) {
    if ((sVar2 < 5) || (iVar1 = strcmp(filename + (sVar2 - 4),".rst"), iVar1 != 0)) {
      if ((sVar2 < 5) || (iVar1 = strcmp(filename + (sVar2 - 4),".sol"), iVar1 != 0)) {
        if ((sVar2 < 6) || (iVar1 = strcmp(filename + (sVar2 - 5),".solb"), iVar1 != 0)) {
          if ((sVar2 < 6) || (iVar1 = strcmp(filename + (sVar2 - 5),".snap"), iVar1 != 0)) {
            if ((sVar2 < 5) || (iVar1 = strcmp(filename + (sVar2 - 4),".plt"), iVar1 != 0)) {
              printf("%s: %d: %s %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xcce,"input file name extension unknown",filename);
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xcd0,"ref_part_scalar",1,"unknown file extension");
              ref_grid_local._4_4_ = 1;
            }
            else {
              ref_grid_local._4_4_ = ref_part_scalar_plt(ref_grid,ldim,scalar,filename);
              if (ref_grid_local._4_4_ == 0) {
                ref_grid_local._4_4_ = 0;
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                       ,0xcca,"ref_part_scalar",(ulong)ref_grid_local._4_4_,"snap failed");
              }
            }
          }
          else {
            ref_grid_local._4_4_ = ref_part_scalar_snap(ref_node_00,ldim,scalar,filename);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                     ,0xcc6,"ref_part_scalar",(ulong)ref_grid_local._4_4_,"snap failed");
            }
          }
        }
        else {
          ref_grid_local._4_4_ = ref_part_scalar_solb(ref_node_00,ldim,scalar,filename);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                   0xcc2,"ref_part_scalar",(ulong)ref_grid_local._4_4_,"solb failed");
          }
        }
      }
      else {
        ref_grid_local._4_4_ = ref_part_scalar_sol(ref_node_00,ldim,scalar,filename);
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
                 0xcbe,"ref_part_scalar",(ulong)ref_grid_local._4_4_,"sol failed");
        }
      }
    }
    else {
      ref_grid_local._4_4_ = ref_part_scalar_rst(ref_node_00,ldim,scalar,filename);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",
               0xcba,"ref_part_scalar",(ulong)ref_grid_local._4_4_,"rst failed");
      }
    }
  }
  else {
    ref_grid_local._4_4_ = ref_part_scalar_cell_restart_sol(ref_grid,ldim,scalar,filename);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0xcb6,
             "ref_part_scalar",(ulong)ref_grid_local._4_4_,"restart_sol failed");
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_part_scalar(REF_GRID ref_grid, REF_INT *ldim,
                                   REF_DBL **scalar, const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".restart_sol") == 0) {
    RSS(ref_part_scalar_cell_restart_sol(ref_grid, ldim, scalar, filename),
        "restart_sol failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".rst") == 0) {
    RSS(ref_part_scalar_rst(ref_node, ldim, scalar, filename), "rst failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".sol") == 0) {
    RSS(ref_part_scalar_sol(ref_node, ldim, scalar, filename), "sol failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0) {
    RSS(ref_part_scalar_solb(ref_node, ldim, scalar, filename), "solb failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".snap") == 0) {
    RSS(ref_part_scalar_snap(ref_node, ldim, scalar, filename), "snap failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_part_scalar_plt(ref_grid, ldim, scalar, filename), "snap failed");
    return REF_SUCCESS;
  }

  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  RSS(REF_FAILURE, "unknown file extension");
  return REF_FAILURE;
}